

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall GlobOpt::GetVarConstantValue(GlobOpt *this,AddrOpnd *addrOpnd)

{
  AddrOpnd *this_00;
  Value *pVVar1;
  bool bVar2;
  charcount_t cVar3;
  ValueNumber VVar4;
  ValueNumber VVar5;
  char16 *pcVar6;
  Sym *pSVar7;
  GlobOptBlockData *pGVar8;
  Value *pVVar9;
  VarConstantValueInfo *pVVar10;
  Var pvVar11;
  ValueInfo *pVVar12;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar13;
  bool local_93;
  undefined1 local_90 [8];
  InternalString cachedInternalString;
  JITJavascriptString *cachedString;
  ValueInfo *symStoreValueInfo_1;
  Value *symStoreValue_1;
  Sym *symStore_1;
  InternalString internalString;
  JITJavascriptString *jsString;
  ValueInfo *symStoreValueInfo;
  Value *symStoreValue;
  Sym *symStore;
  Value *cachedValue;
  Value *val;
  bool isString;
  AddrOpnd *pAStack_18;
  bool isVar;
  AddrOpnd *addrOpnd_local;
  GlobOpt *this_local;
  
  pAStack_18 = addrOpnd;
  addrOpnd_local = (AddrOpnd *)this;
  val._7_1_ = IR::AddrOpnd::IsVar(addrOpnd);
  local_93 = false;
  if (((bool)val._7_1_) && (local_93 = false, pAStack_18->m_localAddress != (Var)0x0)) {
    local_93 = JITJavascriptString::Is(pAStack_18->m_localAddress);
  }
  val._6_1_ = local_93;
  cachedValue = (Value *)0x0;
  symStore = (Sym *)0x0;
  bVar2 = JsUtil::
          BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->addrConstantToValueMap,&pAStack_18->m_address,(Value **)&symStore);
  if (bVar2) {
    pVVar12 = ::Value::GetValueInfo((Value *)symStore);
    pSVar7 = ValueInfo::GetSymStore(pVVar12);
    pVVar1 = cachedValue;
    if (pSVar7 != (Sym *)0x0) {
      pGVar8 = CurrentBlockData(this);
      bVar2 = GlobOptBlockData::IsLive(pGVar8,pSVar7);
      pVVar1 = cachedValue;
      if (bVar2) {
        pGVar8 = CurrentBlockData(this);
        pVVar9 = GlobOptBlockData::FindValue(pGVar8,pSVar7);
        pVVar1 = cachedValue;
        if (pVVar9 != (Value *)0x0) {
          VVar4 = ::Value::GetValueNumber(pVVar9);
          VVar5 = ::Value::GetValueNumber((Value *)symStore);
          pVVar1 = cachedValue;
          if (VVar4 == VVar5) {
            pVVar12 = ::Value::GetValueInfo(pVVar9);
            bVar2 = ValueInfo::IsVarConstant(pVVar12);
            pVVar1 = cachedValue;
            if (bVar2) {
              pVVar10 = ValueInfo::AsVarConstant(pVVar12);
              pvVar11 = VarConstantValueInfo::VarValue(pVVar10,false);
              pVVar1 = cachedValue;
              if (pvVar11 == pAStack_18->m_address) {
                pVVar1 = pVVar9;
              }
            }
          }
        }
      }
    }
  }
  else {
    pVVar1 = cachedValue;
    if ((val._6_1_ & 1) != 0) {
      internalString.m_content.ptr =
           (char16_t *)JITJavascriptString::FromVar(pAStack_18->m_localAddress);
      pcVar6 = JITJavascriptString::GetString((JITJavascriptString *)internalString.m_content.ptr);
      cVar3 = JITJavascriptString::GetLength((JITJavascriptString *)internalString.m_content.ptr);
      Js::InternalString::InternalString((InternalString *)&symStore_1,pcVar6,cVar3,'\0');
      bVar2 = JsUtil::
              BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<Js::InternalString>
                        (this->stringConstantToValueMap,(InternalString *)&symStore_1,
                         (Value **)&symStore);
      pVVar1 = cachedValue;
      if (bVar2) {
        pVVar12 = ::Value::GetValueInfo((Value *)symStore);
        pSVar7 = ValueInfo::GetSymStore(pVVar12);
        pVVar1 = cachedValue;
        if (pSVar7 != (Sym *)0x0) {
          pGVar8 = CurrentBlockData(this);
          bVar2 = GlobOptBlockData::IsLive(pGVar8,pSVar7);
          pVVar1 = cachedValue;
          if (bVar2) {
            pGVar8 = CurrentBlockData(this);
            pVVar9 = GlobOptBlockData::FindValue(pGVar8,pSVar7);
            pVVar1 = cachedValue;
            if (pVVar9 != (Value *)0x0) {
              VVar4 = ::Value::GetValueNumber(pVVar9);
              VVar5 = ::Value::GetValueNumber((Value *)symStore);
              pVVar1 = cachedValue;
              if (VVar4 == VVar5) {
                pVVar12 = ::Value::GetValueInfo(pVVar9);
                bVar2 = ValueInfo::IsVarConstant(pVVar12);
                pVVar1 = cachedValue;
                if (bVar2) {
                  pVVar12 = ::Value::GetValueInfo(pVVar9);
                  pVVar10 = ValueInfo::AsVarConstant(pVVar12);
                  pvVar11 = VarConstantValueInfo::VarValue(pVVar10,true);
                  cachedInternalString.m_content.ptr =
                       (char16_t *)JITJavascriptString::FromVar(pvVar11);
                  pcVar6 = JITJavascriptString::GetString
                                     ((JITJavascriptString *)cachedInternalString.m_content.ptr);
                  cVar3 = JITJavascriptString::GetLength
                                    ((JITJavascriptString *)cachedInternalString.m_content.ptr);
                  Js::InternalString::InternalString((InternalString *)local_90,pcVar6,cVar3,'\0');
                  bVar2 = Js::InternalStringComparer::Equals
                                    ((InternalString *)&symStore_1,(InternalString *)local_90);
                  pVVar1 = pVVar9;
                  if (!bVar2) {
                    pVVar1 = cachedValue;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  cachedValue = pVVar1;
  if (cachedValue == (Value *)0x0) {
    cachedValue = NewVarConstantValue(this,pAStack_18,(bool)(val._6_1_ & 1));
  }
  this_00 = pAStack_18;
  pVVar12 = ::Value::GetValueInfo(cachedValue);
  paVar13 = &ValueInfo::Type(pVVar12)->field_0;
  IR::Opnd::SetValueType
            (&this_00->super_Opnd,
             (ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar13->field_0);
  return cachedValue;
}

Assistant:

Value *
GlobOpt::GetVarConstantValue(IR::AddrOpnd *addrOpnd)
{
    bool isVar = addrOpnd->IsVar();
    bool isString = isVar && addrOpnd->m_localAddress && JITJavascriptString::Is(addrOpnd->m_localAddress);
    Value *val = nullptr;
    Value *cachedValue = nullptr;
    if(this->addrConstantToValueMap->TryGetValue(addrOpnd->m_address, &cachedValue))
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *symStore = cachedValue->GetValueInfo()->GetSymStore();
        if(symStore && CurrentBlockData()->IsLive(symStore))
        {
            Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
            if(symStoreValue && symStoreValue->GetValueNumber() == cachedValue->GetValueNumber())
            {
                ValueInfo *const symStoreValueInfo = symStoreValue->GetValueInfo();
                if(symStoreValueInfo->IsVarConstant() && symStoreValueInfo->AsVarConstant()->VarValue() == addrOpnd->m_address)
                {
                    val = symStoreValue;
                }
            }
        }
    }
    else if (isString)
    {
        JITJavascriptString* jsString = JITJavascriptString::FromVar(addrOpnd->m_localAddress);
        Js::InternalString internalString(jsString->GetString(), jsString->GetLength());
        if (this->stringConstantToValueMap->TryGetValue(internalString, &cachedValue))
        {
            Sym *symStore = cachedValue->GetValueInfo()->GetSymStore();
            if (symStore && CurrentBlockData()->IsLive(symStore))
            {
                Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
                if (symStoreValue && symStoreValue->GetValueNumber() == cachedValue->GetValueNumber())
                {
                    ValueInfo *const symStoreValueInfo = symStoreValue->GetValueInfo();
                    if (symStoreValueInfo->IsVarConstant())
                    {
                        JITJavascriptString * cachedString = JITJavascriptString::FromVar(symStoreValue->GetValueInfo()->AsVarConstant()->VarValue(true));
                        Js::InternalString cachedInternalString(cachedString->GetString(), cachedString->GetLength());
                        if (Js::InternalStringComparer::Equals(internalString, cachedInternalString))
                        {
                            val = symStoreValue;
                        }
                    }
                }
            }
        }
    }

    if(!val)
    {
        val = NewVarConstantValue(addrOpnd, isString);
    }

    addrOpnd->SetValueType(val->GetValueInfo()->Type());
    return val;
}